

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::FormVersion(Form Form)

{
  undefined4 local_c;
  Form Form_local;
  
  if (Form == DW_FORM_addr) {
    local_c = 2;
  }
  else if (Form == DW_FORM_block2) {
    local_c = 2;
  }
  else if (Form == DW_FORM_block4) {
    local_c = 2;
  }
  else if (Form == DW_FORM_data2) {
    local_c = 2;
  }
  else if (Form == DW_FORM_data4) {
    local_c = 2;
  }
  else if (Form == DW_FORM_data8) {
    local_c = 2;
  }
  else if (Form == DW_FORM_string) {
    local_c = 2;
  }
  else if (Form == DW_FORM_block) {
    local_c = 2;
  }
  else if (Form == DW_FORM_block1) {
    local_c = 2;
  }
  else if (Form == DW_FORM_data1) {
    local_c = 2;
  }
  else if (Form == DW_FORM_flag) {
    local_c = 2;
  }
  else if (Form == DW_FORM_sdata) {
    local_c = 2;
  }
  else if (Form == DW_FORM_strp) {
    local_c = 2;
  }
  else if (Form == DW_FORM_udata) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref_addr) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref1) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref2) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref4) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref8) {
    local_c = 2;
  }
  else if (Form == DW_FORM_ref_udata) {
    local_c = 2;
  }
  else if (Form == DW_FORM_indirect) {
    local_c = 2;
  }
  else if (Form == DW_FORM_sec_offset) {
    local_c = 4;
  }
  else if (Form == DW_FORM_exprloc) {
    local_c = 4;
  }
  else if (Form == DW_FORM_flag_present) {
    local_c = 4;
  }
  else if (Form == DW_FORM_strx) {
    local_c = 5;
  }
  else if (Form == DW_FORM_addrx) {
    local_c = 5;
  }
  else if (Form == DW_FORM_ref_sup4) {
    local_c = 5;
  }
  else if (Form == DW_FORM_strp_sup) {
    local_c = 5;
  }
  else if (Form == DW_FORM_data16) {
    local_c = 5;
  }
  else if (Form == DW_FORM_line_strp) {
    local_c = 5;
  }
  else if (Form == DW_FORM_ref_sig8) {
    local_c = 4;
  }
  else if (Form == DW_FORM_implicit_const) {
    local_c = 5;
  }
  else if (Form == DW_FORM_loclistx) {
    local_c = 5;
  }
  else if (Form == DW_FORM_rnglistx) {
    local_c = 5;
  }
  else if (Form == DW_FORM_ref_sup8) {
    local_c = 5;
  }
  else if (Form == DW_FORM_strx1) {
    local_c = 5;
  }
  else if (Form == DW_FORM_strx2) {
    local_c = 5;
  }
  else if (Form == DW_FORM_strx3) {
    local_c = 5;
  }
  else if (Form == DW_FORM_strx4) {
    local_c = 5;
  }
  else if (Form == DW_FORM_addrx1) {
    local_c = 5;
  }
  else if (Form == DW_FORM_addrx2) {
    local_c = 5;
  }
  else if (Form == DW_FORM_addrx3) {
    local_c = 5;
  }
  else if (Form == DW_FORM_addrx4) {
    local_c = 5;
  }
  else if (Form == DW_FORM_GNU_addr_index) {
    local_c = 0;
  }
  else if (Form == DW_FORM_GNU_str_index) {
    local_c = 0;
  }
  else if (Form == DW_FORM_GNU_ref_alt) {
    local_c = 0;
  }
  else if (Form == DW_FORM_GNU_strp_alt) {
    local_c = 0;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned llvm::dwarf::FormVersion(dwarf::Form Form) {
  switch (Form) {
  default:
    return 0;
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}